

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# illegal_opcodes.c
# Opt level: O0

uint8_t zeropage_SLO(cpu_registers *registers)

{
  byte bVar1;
  uint8_t local_11;
  cpu_registers *pcStack_10;
  uint8_t data;
  cpu_registers *registers_local;
  
  pcStack_10 = registers;
  local_11 = fetch_zeropage(registers);
  base_shift_left(pcStack_10,&local_11);
  bVar1 = calc_zeropage_address(pcStack_10);
  base_store((ushort)bVar1,&local_11);
  base_or(pcStack_10,local_11);
  return '\0';
}

Assistant:

uint8_t zeropage_SLO(cpu_registers* registers) {
    uint8_t data = fetch_zeropage(registers);
    base_shift_left(registers, &data);
    base_store(calc_zeropage_address(registers), &data);
    base_or(registers, data);
    return ZERO_EXTRA_CYCLES;
}